

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# re2_regex.cpp
# Opt level: O1

vector<duckdb_re2::Match,_true> *
duckdb_re2::RegexFindAll
          (vector<duckdb_re2::Match,_true> *__return_storage_ptr__,char *input_data,
          size_t input_size,RE2 *regex)

{
  byte bVar1;
  uint uVar2;
  bool bVar3;
  GroupMatch *pGVar4;
  InvalidInputException *this;
  long lVar5;
  size_t start;
  Match match;
  Match local_88;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  start = 0;
  (__return_storage_ptr__->super_vector<duckdb_re2::Match,_std::allocator<duckdb_re2::Match>_>).
  super__Vector_base<duckdb_re2::Match,_std::allocator<duckdb_re2::Match>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->super_vector<duckdb_re2::Match,_std::allocator<duckdb_re2::Match>_>).
  super__Vector_base<duckdb_re2::Match,_std::allocator<duckdb_re2::Match>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super_vector<duckdb_re2::Match,_std::allocator<duckdb_re2::Match>_>).
  super__Vector_base<duckdb_re2::Match,_std::allocator<duckdb_re2::Match>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_88.groups.super_vector<duckdb_re2::GroupMatch,_std::allocator<duckdb_re2::GroupMatch>_>.
  super__Vector_base<duckdb_re2::GroupMatch,_std::allocator<duckdb_re2::GroupMatch>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_88.groups.super_vector<duckdb_re2::GroupMatch,_std::allocator<duckdb_re2::GroupMatch>_>.
  super__Vector_base<duckdb_re2::GroupMatch,_std::allocator<duckdb_re2::GroupMatch>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_88.groups.super_vector<duckdb_re2::GroupMatch,_std::allocator<duckdb_re2::GroupMatch>_>.
  super__Vector_base<duckdb_re2::GroupMatch,_std::allocator<duckdb_re2::GroupMatch>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  do {
    bVar3 = RegexSearchInternal(input_data,input_size,&local_88,regex,UNANCHORED,start,input_size);
    if (!bVar3) {
LAB_0141657c:
      duckdb::std::vector<duckdb_re2::GroupMatch,_std::allocator<duckdb_re2::GroupMatch>_>::~vector
                ((vector<duckdb_re2::GroupMatch,_std::allocator<duckdb_re2::GroupMatch>_> *)
                 &local_88);
      return __return_storage_ptr__;
    }
    pGVar4 = Match::GetGroup(&local_88,0);
    if ((pGVar4->text)._M_string_length == 0) {
      pGVar4 = Match::GetGroup(&local_88,0);
      bVar1 = input_data[pGVar4->position];
      lVar5 = 1;
      if ((((char)bVar1 < '\0') && (lVar5 = 2, (bVar1 & 0xe0) != 0xc0)) &&
         (lVar5 = 3, (bVar1 & 0xf0) != 0xe0)) {
        lVar5 = (ulong)((bVar1 & 0xf8) == 0xf0) << 2;
      }
      if (lVar5 == 0) {
        this = (InvalidInputException *)__cxa_allocate_exception(0x10);
        pGVar4 = Match::GetGroup(&local_88,0);
        std::__cxx11::to_string(&local_70,(ulong)pGVar4->position + 1);
        std::operator+(&local_50,"Invalid UTF-8 leading byte at position ",&local_70);
        duckdb::InvalidInputException::InvalidInputException(this,(string *)&local_50);
        __cxa_throw(this,&duckdb::InvalidInputException::typeinfo,std::runtime_error::~runtime_error
                   );
      }
      pGVar4 = Match::GetGroup(&local_88,0);
      if (input_size <= (ulong)pGVar4->position + lVar5) {
        std::vector<duckdb_re2::Match,std::allocator<duckdb_re2::Match>>::
        emplace_back<duckdb_re2::Match&>
                  ((vector<duckdb_re2::Match,std::allocator<duckdb_re2::Match>> *)
                   __return_storage_ptr__,&local_88);
        goto LAB_0141657c;
      }
      pGVar4 = Match::GetGroup(&local_88,0);
      start = lVar5 + (ulong)pGVar4->position;
    }
    else {
      pGVar4 = Match::GetGroup(&local_88,0);
      uVar2 = pGVar4->position;
      pGVar4 = Match::GetGroup(&local_88,0);
      start = (ulong)uVar2 + (pGVar4->text)._M_string_length;
    }
    std::vector<duckdb_re2::Match,std::allocator<duckdb_re2::Match>>::
    emplace_back<duckdb_re2::Match&>
              ((vector<duckdb_re2::Match,std::allocator<duckdb_re2::Match>> *)__return_storage_ptr__
               ,&local_88);
  } while( true );
}

Assistant:

duckdb::vector<Match> RegexFindAll(const char *input_data, size_t input_size, const RE2 &regex) {
	duckdb::vector<Match> matches;
	size_t position = 0;
	Match match;
	while (RegexSearchInternal(input_data, input_size, match, regex, RE2::UNANCHORED, position, input_size)) {
		if (match.length(0)) {
			position = match.position(0) + match.length(0);
		} else { // match.length(0) == 0
			auto next_char_length = GetMultibyteCharLength(input_data[match.position(0)]);
			if (!next_char_length) {
				throw duckdb::InvalidInputException("Invalid UTF-8 leading byte at position " +
				                                    std::to_string(match.position(0) + 1));
			}
			if (match.position(0) + next_char_length < input_size) {
				position = match.position(0) + next_char_length;
			} else {
				matches.emplace_back(match);
				break;
			}
		}
		matches.emplace_back(match);
	}
	return matches;
}